

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O0

bool __thiscall
Parameter<double>::internalSetData<std::__cxx11::string>
          (Parameter<double> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data)

{
  bool bVar1;
  string *in_RSI;
  long in_RDI;
  bool result;
  double tmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  RepType local_18 [3];
  
  local_18[0] = 0.0;
  std::__cxx11::string::string((string *)&local_40,in_RSI);
  bVar1 = ParameterTraits<double>::convert<std::__cxx11::string>(&local_40,local_18);
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    *(undefined1 *)(in_RDI + 0x2a) = 0;
    *(RepType *)(in_RDI + 0x30) = local_18[0];
  }
  return bVar1;
}

Assistant:

bool internalSetData(T data) {
    ParamType tmp {};
    bool result = ValueType::convert(data, tmp);
    if (result) {
      empty_ = false;
      data_  = tmp;
    }
    return result;
  }